

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::RealMath2Function<&pow>::~RealMath2Function(RealMath2Function<&pow> *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  operator_delete(this,0x68);
  return;
}

Assistant:

RealMath2Function(const Builtins& builtins, KnownSystemName knownNameId) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 2,
                               {&builtins.realType, &builtins.realType}, builtins.realType, false) {
    }